

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

MeasureUnit *
icu_63::MeasureUnit::resolveUnitPerUnit
          (MeasureUnit *__return_storage_ptr__,MeasureUnit *unit,MeasureUnit *perUnit,
          bool *isResolved)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar4 = unit->fSubTypeId + (&gOffsets)[unit->fTypeId];
  iVar2 = perUnit->fSubTypeId + (&gOffsets)[perUnit->fTypeId];
  iVar5 = 8;
  iVar7 = 0;
  do {
    iVar6 = (iVar7 + iVar5) / 2;
    lVar3 = (long)iVar6 * 0x10;
    if (*(int *)(unitPerUnitToSingleUnit + lVar3) <= iVar4) {
      if (iVar4 <= *(int *)(unitPerUnitToSingleUnit + lVar3)) {
        if (iVar2 < *(int *)(unitPerUnitToSingleUnit + lVar3 + 4)) goto LAB_002ee541;
        if (iVar2 <= *(int *)(unitPerUnitToSingleUnit + lVar3 + 4)) {
          *isResolved = true;
          (__return_storage_ptr__->super_UObject)._vptr_UObject =
               (_func_int **)&PTR__MeasureUnit_00479ce0;
          uVar1 = *(undefined8 *)(unitPerUnitToSingleUnit + lVar3 + 8);
          __return_storage_ptr__->fTypeId = (int)uVar1;
          __return_storage_ptr__->fSubTypeId = (int)((ulong)uVar1 >> 0x20);
          __return_storage_ptr__->fCurrency[0] = '\0';
          return __return_storage_ptr__;
        }
      }
      iVar7 = iVar6 + 1;
      iVar6 = iVar5;
    }
LAB_002ee541:
    iVar5 = iVar6;
    if (iVar5 <= iVar7) {
      *isResolved = false;
      (__return_storage_ptr__->super_UObject)._vptr_UObject =
           (_func_int **)&PTR__MeasureUnit_00479ce0;
      __return_storage_ptr__->fCurrency[0] = '\0';
      __return_storage_ptr__->fTypeId = 0xe;
      __return_storage_ptr__->fSubTypeId = 0;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

int32_t MeasureUnit::getOffset() const {
    return gOffsets[fTypeId] + fSubTypeId;
}